

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::registerAward(Map *this,char type,int duration)

{
  int i;
  int iVar1;
  long lVar2;
  Award *pAVar3;
  
  lVar2 = 0;
  while ((this->award[lVar2] == (Award *)0x0 || (this->award[lVar2]->type != type))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x14) {
      lVar2 = 0;
      do {
        if (this->award[lVar2] == (Award *)0x0) {
          pAVar3 = (Award *)malloc(0xc);
          this->award[lVar2] = pAVar3;
          iVar1 = SDL_GetTicks();
          pAVar3 = this->award[lVar2];
          pAVar3->activationTime = iVar1;
          pAVar3->type = type;
          pAVar3->duration = duration;
          return;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x14);
      return;
    }
  }
  return;
}

Assistant:

void Map::registerAward(char type, int duration){
    for(int i=0; i< MAX_AWARDS; i++){
        if(award[i] && award[i]->type == type){
            return;
        }
    }
    for(int i=0; i< MAX_AWARDS; i++){
        if(!award[i]){
            award[i] = (Award *)malloc(sizeof(Award));
            award[i]->activationTime = SDL_GetTicks();
            award[i]->type = type;
            award[i]->duration = duration;
            break;
        }
    }
}